

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_> *node)

{
  pointer pTVar1;
  unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_> *in_RDX;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_60;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_58;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_50;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_48 [3];
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_28 [2];
  unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_> *node_local;
  Transformer *this_local;
  
  node_local = node;
  this_local = this;
  pTVar1 = std::unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_30,&pTVar1->cond);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::TernaryOp_*,_std::default_delete<verilogAST::TernaryOp>_>
              .super__Head_base<0UL,_verilogAST::TernaryOp_*,_false>._M_head_impl)->super_Expression
            ).super_Node)(local_28,node,&local_30);
  pTVar1 = std::unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pTVar1->cond,local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_28);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_30);
  pTVar1 = std::unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_50,&pTVar1->true_value);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::TernaryOp_*,_std::default_delete<verilogAST::TernaryOp>_>
              .super__Head_base<0UL,_verilogAST::TernaryOp_*,_false>._M_head_impl)->super_Expression
            ).super_Node)(local_48,node,&local_50);
  pTVar1 = std::unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pTVar1->true_value,local_48);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_48);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_50);
  pTVar1 = std::unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::unique_ptr
            (&local_60,&pTVar1->false_value);
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::TernaryOp_*,_std::default_delete<verilogAST::TernaryOp>_>
              .super__Head_base<0UL,_verilogAST::TernaryOp_*,_false>._M_head_impl)->super_Expression
            ).super_Node)(&local_58,node,&local_60);
  pTVar1 = std::unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>::
           operator->(in_RDX);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::operator=
            (&pTVar1->false_value,&local_58);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_58);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_60);
  std::unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>::unique_ptr
            ((unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_> *)this,
             in_RDX);
  return (__uniq_ptr_data<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>,_true,_true>
          )(__uniq_ptr_data<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TernaryOp> Transformer::visit(std::unique_ptr<TernaryOp> node) {
  node->cond = this->visit(std::move(node->cond));
  node->true_value = this->visit(std::move(node->true_value));
  node->false_value = this->visit(std::move(node->false_value));
  return node;
}